

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::name2dataaddress(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  pointer plVar1;
  char cVar2;
  pointer plVar3;
  pointer plVar4;
  bool bVar5;
  _Alloc_hider __s2;
  size_type sVar6;
  uint uVar7;
  uint src;
  int iVar8;
  size_t sVar9;
  char cVar10;
  string localName;
  string local_58;
  Forth *local_38;
  
  requireDStackAvailable(this,1,"BL");
  this_00 = &this->dStack;
  iVar8 = 0x20;
  ForthStack<unsigned_int>::push(this_00,0x20);
  word(this);
  if ((this->localVariables).
      super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->localVariables).
      super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dup(this,iVar8);
    count(this);
    uVar7 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    src = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    moveFromDataSpace(this,&local_58,src,(ulong)uVar7);
    sVar6 = local_58._M_string_length;
    __s2._M_p = local_58._M_dataplus._M_p;
    if (local_58._M_string_length != 0) {
      sVar9 = 0;
      do {
        cVar2 = local_58._M_dataplus._M_p[sVar9];
        cVar10 = cVar2 + -0x20;
        if (0x19 < (byte)(cVar2 + 0x9fU)) {
          cVar10 = cVar2;
        }
        local_58._M_dataplus._M_p[sVar9] = cVar10;
        sVar9 = sVar9 + 1;
      } while (local_58._M_string_length != sVar9);
    }
    plVar3 = (this->localVariables).
             super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar1 = (this->localVariables).
             super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = this;
    do {
      plVar4 = plVar1;
      bVar5 = plVar4 != plVar3;
      if (!bVar5) goto LAB_0011548f;
      plVar1 = plVar4 + -1;
      sVar9 = plVar4[-1].localName._M_string_length;
    } while ((sVar9 != sVar6) ||
            ((sVar9 != 0 &&
             (iVar8 = bcmp((plVar1->localName)._M_dataplus._M_p,__s2._M_p,sVar9), iVar8 != 0))));
    ForthStack<unsigned_int>::setTop(this_00,plVar4[-1].localAddress);
LAB_0011548f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    this = local_38;
    if (bVar5) {
      return;
    }
  }
  find(this);
  requireDStackDepth(this,1,"DROP");
  ForthStack<unsigned_int>::pop(this_00);
  toBody(this);
  return;
}

Assistant:

void name2dataaddress(){
			bl();word();
			if(localVariables.size()>0){
				dup();
				count();
				auto u=dStack.getTop(); dStack.pop();
				auto address=dStack.getTop(); dStack.pop();
				std::string localName{};
				moveFromDataSpace(localName,address,u);
				for(auto &c: localName) c=toupper_ascii(c);
				for(auto it=localVariables.rbegin(),itEnd=localVariables.rend();it!=itEnd;++it){
					if((*it).localName==localName){
						dStack.setTop((*it).localAddress);
						return;
					}
				}		
			} 
			find();drop();toBody();
			
		}